

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsConvert::flushSymbols(SmodelsConvert *this)

{
  bool bVar1;
  pointer pSVar2;
  size_t s;
  __normal_iterator<Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
  in_RDI;
  Lit_t x;
  const_iterator end;
  const_iterator it;
  vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<const_Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
  in_stack_ffffffffffffffa0;
  Span<char> local_50;
  uint local_3c;
  Symbol *local_38;
  Symbol *local_28;
  __normal_iterator<const_Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
  local_20;
  Symbol *local_18;
  Symbol *local_10;
  
  local_10 = (Symbol *)
             std::
             vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
             ::begin(in_stack_ffffffffffffff88);
  local_18 = (Symbol *)
             std::
             vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
             ::end(in_stack_ffffffffffffff88);
  std::
  sort<__gnu_cxx::__normal_iterator<Potassco::SmodelsConvert::SmData::Symbol*,std::vector<Potassco::SmodelsConvert::SmData::Symbol,std::allocator<Potassco::SmodelsConvert::SmData::Symbol>>>>
            (in_stack_ffffffffffffffa0,in_RDI);
  local_28 = (Symbol *)
             std::
             vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
             ::begin(in_stack_ffffffffffffff88);
  __gnu_cxx::
  __normal_iterator<Potassco::SmodelsConvert::SmData::Symbol_const*,std::vector<Potassco::SmodelsConvert::SmData::Symbol,std::allocator<Potassco::SmodelsConvert::SmData::Symbol>>>
  ::__normal_iterator<Potassco::SmodelsConvert::SmData::Symbol*>
            (in_stack_ffffffffffffff90,
             (__normal_iterator<Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
              *)in_stack_ffffffffffffff88);
  local_38 = (Symbol *)
             std::
             vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
             ::end(in_stack_ffffffffffffff88);
  __gnu_cxx::
  __normal_iterator<Potassco::SmodelsConvert::SmData::Symbol_const*,std::vector<Potassco::SmodelsConvert::SmData::Symbol,std::allocator<Potassco::SmodelsConvert::SmData::Symbol>>>
  ::__normal_iterator<Potassco::SmodelsConvert::SmData::Symbol*>
            (in_stack_ffffffffffffff90,
             (__normal_iterator<Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
              *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff90,
                       (__normal_iterator<const_Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
             ::operator->(&local_20);
    local_3c = *(uint *)pSVar2 & 0x7fffffff;
    in_stack_ffffffffffffff90 =
         (__normal_iterator<const_Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
          *)(in_RDI._M_current)->name;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
             ::operator->(&local_20);
    in_stack_ffffffffffffff88 =
         (vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
          *)pSVar2->name;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
             ::operator->(&local_20);
    s = strlen(pSVar2->name);
    local_50 = toSpan<char>((char *)in_stack_ffffffffffffff88,s);
    toSpan<int>((int *)&local_3c,1);
    (**(code **)(in_stack_ffffffffffffff90->_M_current + 4))
              (in_stack_ffffffffffffff90,&local_50,&stack0xffffffffffffffa0);
    __gnu_cxx::
    __normal_iterator<const_Potassco::SmodelsConvert::SmData::Symbol_*,_std::vector<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void SmodelsConvert::flushSymbols() {
	std::sort(data_->output_.begin(), data_->output_.end());
	for (SmData::OutVec::const_iterator it = data_->output_.begin(), end = data_->output_.end(); it != end; ++it) {
		Lit_t x = static_cast<Lit_t>(it->atom);
		out_.output(toSpan(it->name, std::strlen(it->name)), toSpan(&x, 1));
	}
}